

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void arena_bin_lower_slab(tsdn_t *tsdn,arena_t *arena,edata_t *slab,bin_t *bin)

{
  long *plVar1;
  edata_t *slab_00;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  slab_00 = (edata_t *)slab[1].field_6.e_slab_data.bitmap[4];
  if ((slab_00 == (edata_t *)0x0) ||
     (pvVar2 = slab_00->e_addr, uVar3 = slab_00->e_sn, uVar4 = (arena->stats).metadata_edata,
     iVar6 = ((uint)(uVar3 >= uVar4 && uVar3 != uVar4) - (uint)(uVar3 < uVar4)) * 2,
     pvVar5 = *(void **)&arena->binshard_next,
     iVar8 = (uint)(pvVar2 >= pvVar5 && pvVar2 != pvVar5) - (uint)(pvVar2 < pvVar5),
     iVar9 = iVar8 + iVar6, iVar9 == 0 || SCARRY4(iVar8,iVar6) != iVar9 < 0)) {
    duckdb_je_edata_heap_insert((edata_heap_t *)((long)&slab[1].field_6 + 0x28),(edata_t *)arena);
    lVar7 = 0xb8;
  }
  else {
    if ((slab_00->e_bits & 0x3ff0000000) == 0) {
      arena_bin_slabs_full_insert
                ((arena_t *)
                 (ulong)(uint)tsdn[0x1d].tsd.
                              cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins
                              [0x3f].tstats.nrequests,(bin_t *)slab,slab_00);
    }
    else {
      duckdb_je_edata_heap_insert((edata_heap_t *)((long)&slab[1].field_6 + 0x28),slab_00);
      plVar1 = (long *)((long)&slab[1].field_5 + 0x10);
      *plVar1 = *plVar1 + 1;
    }
    slab[1].field_6.e_slab_data.bitmap[4] = (bitmap_t)arena;
    lVar7 = 0xa8;
  }
  plVar1 = (long *)((long)&slab->e_bits + lVar7);
  *plVar1 = *plVar1 + 1;
  return;
}

Assistant:

static void
arena_bin_lower_slab(tsdn_t *tsdn, arena_t *arena, edata_t *slab,
    bin_t *bin) {
	assert(edata_nfree_get(slab) > 0);

	/*
	 * Make sure that if bin->slabcur is non-NULL, it refers to the
	 * oldest/lowest non-full slab.  It is okay to NULL slabcur out rather
	 * than proactively keeping it pointing at the oldest/lowest non-full
	 * slab.
	 */
	if (bin->slabcur != NULL && edata_snad_comp(bin->slabcur, slab) > 0) {
		/* Switch slabcur. */
		if (edata_nfree_get(bin->slabcur) > 0) {
			arena_bin_slabs_nonfull_insert(bin, bin->slabcur);
		} else {
			arena_bin_slabs_full_insert(arena, bin, bin->slabcur);
		}
		bin->slabcur = slab;
		if (config_stats) {
			bin->stats.reslabs++;
		}
	} else {
		arena_bin_slabs_nonfull_insert(bin, slab);
	}
}